

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O3

void Nwk_ManSupportNodes_rec(Nwk_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  uint uVar2;
  void **ppvVar3;
  long lVar4;
  
  iVar1 = pNode->pMan->nTravIds;
  if (pNode->TravId != iVar1) {
    pNode->TravId = iVar1;
    uVar2 = *(uint *)&pNode->field_0x20 & 7;
    if (uVar2 == 1) {
      uVar2 = vNodes->nSize;
      if (uVar2 == vNodes->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
          }
          vNodes->pArray = ppvVar3;
          vNodes->nCap = 0x10;
        }
        else {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
          }
          vNodes->pArray = ppvVar3;
          vNodes->nCap = uVar2 * 2;
        }
      }
      else {
        ppvVar3 = vNodes->pArray;
      }
      iVar1 = vNodes->nSize;
      vNodes->nSize = iVar1 + 1;
      ppvVar3[iVar1] = pNode;
    }
    else {
      if (uVar2 != 3) {
        __assert_fail("Nwk_ObjIsNode( pNode )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkDfs.c"
                      ,0x1ed,"void Nwk_ManSupportNodes_rec(Nwk_Obj_t *, Vec_Ptr_t *)");
      }
      if (0 < pNode->nFanins) {
        lVar4 = 0;
        do {
          if (pNode->pFanio[lVar4] == (Nwk_Obj_t *)0x0) {
            return;
          }
          Nwk_ManSupportNodes_rec(pNode->pFanio[lVar4],vNodes);
          lVar4 = lVar4 + 1;
        } while (lVar4 < pNode->nFanins);
      }
    }
  }
  return;
}

Assistant:

void Nwk_ManSupportNodes_rec( Nwk_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Nwk_Obj_t * pFanin;
    int i;
    // if this node is already visited, skip
    if ( Nwk_ObjIsTravIdCurrent( pNode ) )
        return;
    // mark the node as visited
    Nwk_ObjSetTravIdCurrent( pNode );
    // collect the CI
    if ( Nwk_ObjIsCi(pNode) )
    {
        Vec_PtrPush( vNodes, pNode );
        return;
    }
    assert( Nwk_ObjIsNode( pNode ) );
    // visit the transitive fanin of the node
    Nwk_ObjForEachFanin( pNode, pFanin, i )
        Nwk_ManSupportNodes_rec( pFanin, vNodes );
}